

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

void dmrC_kill_use(dmr_C *C,pseudo_t *usep)

{
  pseudo_t p;
  
  if (usep != (pseudo_t *)0x0) {
    p = *usep;
    *usep = &C->L->void_pseudo;
    remove_usage(C,p,usep);
    return;
  }
  return;
}

Assistant:

void dmrC_kill_use(struct dmr_C *C, pseudo_t *usep)
{
	if (usep) {
		pseudo_t p = *usep;
		*usep = VOID_PSEUDO(C);
		remove_usage(C, p, usep);
	}
}